

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O2

bool __thiscall Clasp::SatElite::bceVe(SatElite *this,Var v,uint32 maxCnt)

{
  Clause *c2;
  pointer ppCVar1;
  Literal *pLVar2;
  ClauseList *this_00;
  bool bVar3;
  uint *puVar4;
  uint uVar5;
  uint *puVar6;
  size_type sVar7;
  uint uVar8;
  ClIter it;
  Literal *pLVar9;
  ulong uVar10;
  bool freeId;
  ClRange CVar11;
  uint local_80;
  uint local_7c;
  Clause *lhs;
  uint32 local_70;
  uint local_6c;
  Literal *local_68;
  ulong local_60;
  uint *local_58;
  Clause *rhs;
  ulong local_48;
  Literal *local_40;
  ClauseList *local_38;
  
  local_48 = (ulong)v;
  bVar3 = true;
  if ((((*(((this->super_SatPreprocessor).ctx_)->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf
       [local_48] & 3) == 0) {
    (this->resCands_).ebo_.size = 0;
    uVar8 = *(uint *)(this->super_SatPreprocessor).opts_ & 3;
    local_70 = maxCnt;
    CVar11 = splitOcc(this,v,uVar8 == 3);
    local_80 = 0;
    sVar7 = 0;
    if (uVar8 == 3) {
      sVar7 = this->occT_[1].ebo_.size;
    }
    local_38 = &this->resCands_;
    puVar4 = this->occT_[0].ebo_.buf;
    local_6c = (uint)(uVar8 >= 2) << 0x1f;
    local_7c = 0;
    bVar3 = false;
    puVar6 = puVar4;
    while( true ) {
      local_40 = CVar11.second;
      local_68 = CVar11.first;
      local_60 = (ulong)local_7c;
      if ((puVar6 == puVar4 + this->occT_[0].ebo_.size) || (bVar3)) break;
      lhs = (this->super_SatPreprocessor).clauses_.ebo_.buf[*puVar6];
      local_58 = puVar6;
      markAll(this,lhs->lits_,*(uint *)&lhs->field_0x8 & 0x3fffffff);
      *(uint *)&lhs->field_0x8 = *(uint *)&lhs->field_0x8 & 0x7fffffff | local_6c;
      puVar4 = this->occT_[1].ebo_.buf;
      for (puVar6 = puVar4; puVar6 != puVar4 + this->occT_[1].ebo_.size; puVar6 = puVar6 + 1) {
        c2 = (this->super_SatPreprocessor).clauses_.ebo_.buf[*puVar6];
        rhs = c2;
        bVar3 = trivialResolvent(this,c2,v);
        this_00 = local_38;
        if (!bVar3) {
          sVar7 = ((int)*(uint *)&c2->field_0x8 >> 0x1f) + sVar7;
          *(uint *)&c2->field_0x8 = *(uint *)&c2->field_0x8 & 0x7fffffff;
          uVar5 = *(uint *)&lhs->field_0x8 & 0x7fffffff;
          *(uint *)&lhs->field_0x8 = uVar5;
          local_80 = local_80 + 1;
          if (local_70 < local_80) {
            if (sVar7 == 0) {
              sVar7 = 0;
              bVar3 = uVar8 < 2;
              goto LAB_00187b0f;
            }
          }
          else {
            bk_lib::
            pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
            ::push_back(local_38,&lhs);
            bk_lib::
            pod_vector<Clasp::SatPreprocessor::Clause_*,_std::allocator<Clasp::SatPreprocessor::Clause_*>_>
            ::push_back(this_00,&rhs);
          }
        }
        puVar4 = this->occT_[1].ebo_.buf;
      }
      uVar5 = *(uint *)&lhs->field_0x8;
      bVar3 = false;
LAB_00187b0f:
      unmarkAll(this,lhs->lits_,uVar5 & 0x3fffffff);
      CVar11.second = local_40;
      CVar11.first = local_68;
      puVar4 = this->occT_[0].ebo_.buf;
      if (*(int *)&lhs->field_0x8 < 0) {
        local_7c = local_7c + 1;
        puVar4[local_60] = *local_58;
      }
      puVar6 = local_58 + 1;
    }
    if (local_70 < local_80) {
      if (local_7c + sVar7 != 0) {
        uVar10 = 0;
        while( true ) {
          local_40 = CVar11.second;
          local_68 = CVar11.first;
          if (local_60 == uVar10) break;
          bceVeRemove(this,this->occT_[0].ebo_.buf[uVar10],false,v,true);
          CVar11.second = local_40;
          CVar11.first = local_68;
          uVar10 = uVar10 + 1;
        }
        puVar4 = this->occT_[1].ebo_.buf;
        while( true ) {
          local_40 = CVar11.second;
          local_68 = CVar11.first;
          if (sVar7 == 0) break;
          rhs = (this->super_SatPreprocessor).clauses_.ebo_.buf[*puVar4];
          if (*(int *)&rhs->field_0x8 < 0) {
            bceVeRemove(this,*puVar4,false,v,true);
            CVar11.second = local_40;
            CVar11.first = local_68;
            sVar7 = sVar7 - 1;
          }
          puVar4 = puVar4 + 1;
        }
      }
    }
    else {
      SharedContext::eliminate((this->super_SatPreprocessor).ctx_,v);
      for (pLVar9 = local_68; pLVar2 = local_68, pLVar9 != local_40; pLVar9 = pLVar9 + 1) {
        uVar8 = pLVar9->rep_ >> 2;
        if ((this->super_SatPreprocessor).clauses_.ebo_.buf[uVar8] != (Clause *)0x0) {
          freeId = local_80 != 0;
          bVar3 = local_80 == 0;
          local_80 = local_80 - 1;
          if (bVar3) {
            local_80 = 0;
          }
          bceVeRemove(this,uVar8,freeId,v,false);
        }
      }
      for (uVar10 = 0; (size_type)uVar10 != (this->resCands_).ebo_.size; uVar10 = uVar10 + 2) {
        ppCVar1 = (this->resCands_).ebo_.buf;
        bVar3 = addResolvent(this,*(uint *)((long)&pLVar2->rep_ + uVar10 * 2) >> 2,
                             ppCVar1[uVar10 & 0xffffffff],ppCVar1[(size_type)uVar10 + 1]);
        if (!bVar3) {
          return false;
        }
      }
      OccurList::clear(this->occurs_ + local_48);
      CVar11.second = local_40;
      CVar11.first = local_68;
    }
    local_40 = CVar11.second;
    local_68 = CVar11.first;
    bVar3 = true;
    if (((ulong)*(this->super_SatPreprocessor).opts_ & 0x1ffc) == 0) {
      bVar3 = backwardSubsume(this);
    }
  }
  return bVar3;
}

Assistant:

bool SatElite::bceVe(Var v, uint32 maxCnt) {
	Solver* s = ctx_->master();
	if (s->value(v) != value_free) return true;
	assert(!ctx_->varInfo(v).frozen() && !ctx_->eliminated(v));
	resCands_.clear();
	// distribute clauses on v
	// check if number of clauses decreases if we'd eliminate v
	uint32 bce     = opts_->bce();
	ClRange cls    = splitOcc(v, bce > 1);
	uint32 cnt     = 0;
	uint32 markMax = ((uint32)occT_[neg].size() * (bce>1));
	uint32 blocked = 0;
	bool stop      = false;
	Clause* lhs, *rhs;
	for (VarVec::const_iterator i = occT_[pos].begin(); i != occT_[pos].end() && !stop; ++i) {
		lhs         = clause(*i);
		markAll(&(*lhs)[0], lhs->size());
		lhs->setMarked(bce != 0);
		for (VarVec::const_iterator j = occT_[neg].begin(); j != occT_[neg].end(); ++j) {
			if (!trivialResolvent(*(rhs = clause(*j)), v)) {
				markMax -= rhs->marked();
				rhs->setMarked(false); // not blocked on v
				lhs->setMarked(false); // not blocked on v
				if (++cnt <= maxCnt) {
					resCands_.push_back(lhs);
					resCands_.push_back(rhs);
				}
				else if (!markMax) {
					stop = (bce == 0);
					break;
				}
			}
		}
		unmarkAll(&(*lhs)[0], lhs->size());
		if (lhs->marked()) {
			occT_[pos][blocked++] = *i;
		}
	}
	if (cnt <= maxCnt) {
		// eliminate v by clause distribution
		ctx_->eliminate(v);  // mark var as eliminated
		// remove old clauses, store them in the elimination table so that
		// (partial) models can be extended.
		for (ClIter it = cls.first; it != cls.second; ++it) {
			// reuse first cnt ids for resolvents
			if (clause(it->var())) {
				bool freeId = (cnt && cnt--);
				bceVeRemove(it->var(), freeId, v, false);
			}
		}
		// add non trivial resolvents
		assert( resCands_.size() % 2 == 0 );
		ClIter it = cls.first;
		for (VarVec::size_type i = 0; i != resCands_.size(); i+=2, ++it) {
			if (!addResolvent(it->var(), *resCands_[i], *resCands_[i+1])) {
				return false;
			}
		}
		assert(occurs_[v].numOcc() == 0);
		// release memory
		occurs_[v].clear();
	}
	else if ( (blocked + markMax) > 0 ) {
		// remove blocked clauses
		for (uint32 i = 0; i != blocked; ++i) {
			bceVeRemove(occT_[pos][i], false, v, true);
		}
		for (VarVec::const_iterator it = occT_[neg].begin(); markMax; ++it) {
			if ( (rhs = clause(*it))->marked() ) {
				bceVeRemove(*it, false, v, true);
				--markMax;
			}
		}
	}
	return opts_->limIters != 0 || backwardSubsume();
}